

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.cpp
# Opt level: O1

void duckdb::SetBitOperation(DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  idx_t count;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  anon_union_16_2_67f50693_for_value *paVar3;
  byte bVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  reference this_00;
  reference this_01;
  reference this_02;
  idx_t iVar7;
  ulong uVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  idx_t iVar10;
  ulong uVar11;
  idx_t iVar12;
  ulong uVar13;
  ValidityMask *in_R9;
  idx_t idx_in_entry;
  idx_t iVar14;
  ulong uVar15;
  data_ptr_t pdVar16;
  string_t sVar17;
  anon_struct_16_3_d7536bce_for_pointer aVar18;
  string_t a;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  idx_t in_stack_fffffffffffffeb8;
  data_ptr_t pdVar19;
  element_type *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_120;
  buffer_ptr<ValidityBuffer> *local_118;
  idx_t local_110;
  UnifiedVectorFormat local_108;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  this_00 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  this_01 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  this_02 = vector<duckdb::Vector,_true>::operator[](&args->data,2);
  count = args->count;
  if (((this_00->vector_type == CONSTANT_VECTOR) && (this_01->vector_type == CONSTANT_VECTOR)) &&
     (this_02->vector_type == CONSTANT_VECTOR)) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar2 = (this_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) ||
        ((puVar2 = (this_01->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
         puVar2 != (unsigned_long *)0x0 && ((*puVar2 & 1) == 0)))) ||
       ((puVar2 = (this_02->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar2 != (unsigned_long *)0x0 && ((*puVar2 & 1) == 0)))) {
      ConstantVector::SetNull(result,true);
      return;
    }
    paVar3 = (anon_union_16_2_67f50693_for_value *)result->data;
    aVar18 = (anon_struct_16_3_d7536bce_for_pointer)
             TernaryLambdaWrapper::
             Operation<duckdb::SetBitOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,int,int,duckdb::string_t>
                       ((anon_class_8_1_6971b95b)result,
                        (string_t)((anon_union_16_2_67f50693_for_value *)this_00->data)->pointer,
                        *(int *)this_01->data,*(int *)this_02->data,in_R9,in_stack_fffffffffffffeb8)
    ;
    paVar3->pointer = aVar18;
  }
  else {
    Vector::SetVectorType(result,FLAT_VECTOR);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_108);
    Vector::ToUnifiedFormat(this_00,count,&local_78);
    Vector::ToUnifiedFormat(this_01,count,&local_c0);
    Vector::ToUnifiedFormat(this_02,count,&local_108);
    pdVar16 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) &&
        (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0)) &&
       (local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0)) {
      if (count != 0) {
        pdVar16 = pdVar16 + 8;
        iVar14 = 0;
        pdVar19 = local_108.data;
        do {
          iVar7 = iVar14;
          if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
            iVar7 = (idx_t)(local_78.sel)->sel_vector[iVar14];
          }
          iVar10 = iVar14;
          if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
            iVar10 = (idx_t)(local_c0.sel)->sel_vector[iVar14];
          }
          iVar12 = iVar14;
          if ((local_108.sel)->sel_vector != (sel_t *)0x0) {
            iVar12 = (idx_t)(local_108.sel)->sel_vector[iVar14];
          }
          a.value.pointer.ptr = (char *)*(undefined8 *)(local_78.data + iVar7 * 0x10 + 8);
          a.value._0_8_ = *(undefined8 *)(local_78.data + iVar7 * 0x10);
          sVar17 = TernaryLambdaWrapper::
                   Operation<duckdb::SetBitOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,int,int,duckdb::string_t>
                             ((anon_class_8_1_6971b95b)result,a,*(int *)(local_c0.data + iVar10 * 4)
                              ,*(int *)(pdVar19 + iVar12 * 4),in_R9,(idx_t)pdVar19);
          *(long *)(pdVar16 + -8) = sVar17.value._0_8_;
          *(long *)pdVar16 = sVar17.value._8_8_;
          iVar14 = iVar14 + 1;
          pdVar16 = pdVar16 + 0x10;
        } while (count != iVar14);
      }
    }
    else if (count != 0) {
      local_118 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      pdVar16 = pdVar16 + 8;
      uVar15 = 0;
      pdVar19 = local_108.data;
      do {
        uVar8 = uVar15;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(local_78.sel)->sel_vector[uVar15];
        }
        uVar11 = uVar15;
        if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
          uVar11 = (ulong)(local_c0.sel)->sel_vector[uVar15];
        }
        uVar13 = uVar15;
        if ((local_108.sel)->sel_vector != (sel_t *)0x0) {
          uVar13 = (ulong)(local_108.sel)->sel_vector[uVar15];
        }
        if (((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) ||
            ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar8 >> 6]
              >> (uVar8 & 0x3f) & 1) != 0)) &&
           (((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 ||
             ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0)) &&
            ((local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 ||
             ((local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0)))))) {
          sVar17.value.pointer.ptr = (char *)*(undefined8 *)(local_78.data + uVar8 * 0x10 + 8);
          sVar17.value._0_8_ = *(undefined8 *)(local_78.data + uVar8 * 0x10);
          sVar17 = TernaryLambdaWrapper::
                   Operation<duckdb::SetBitOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,int,int,duckdb::string_t>
                             ((anon_class_8_1_6971b95b)result,sVar17,
                              *(int *)(local_c0.data + uVar11 * 4),*(int *)(pdVar19 + uVar13 * 4),
                              in_R9,(idx_t)pdVar19);
          *(long *)(pdVar16 + -8) = sVar17.value._0_8_;
          *(long *)pdVar16 = sVar17.value._8_8_;
        }
        else {
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            local_110 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_128,&local_110);
            p_Var6 = p_Stack_120;
            peVar5 = local_128;
            local_128 = (element_type *)0x0;
            p_Stack_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar5;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var6;
            if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            }
            if (p_Stack_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_120);
            }
            pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                               (local_118);
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (unsigned_long *)
                 (pTVar9->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
          }
          bVar4 = (byte)uVar15 & 0x3f;
          puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                   (uVar15 >> 6);
          *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
        }
        uVar15 = uVar15 + 1;
        pdVar16 = pdVar16 + 0x10;
      } while (count != uVar15);
    }
    if (local_108.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_c0.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void SetBitOperation(DataChunk &args, ExpressionState &state, Vector &result) {
	TernaryExecutor::Execute<string_t, int32_t, int32_t, string_t>(
	    args.data[0], args.data[1], args.data[2], result, args.size(),
	    [&](string_t input, int32_t n, int32_t new_value) {
		    if (new_value != 0 && new_value != 1) {
			    throw InvalidInputException("The new bit must be 1 or 0");
		    }
		    if (n < 0 || (idx_t)n > Bit::BitLength(input) - 1) {
			    throw OutOfRangeException("bit index %s out of valid range (0..%s)", NumericHelper::ToString(n),
			                              NumericHelper::ToString(Bit::BitLength(input) - 1));
		    }
		    string_t target = StringVector::EmptyString(result, input.GetSize());
		    memcpy(target.GetDataWriteable(), input.GetData(), input.GetSize());
		    Bit::SetBit(target, UnsafeNumericCast<idx_t>(n), UnsafeNumericCast<idx_t>(new_value));
		    return target;
	    });
}